

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

BoxArray * __thiscall amrex::AmrMesh::MakeBaseGrids(AmrMesh *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  Geometry *this_00;
  BoxArray *pBVar8;
  long *in_RSI;
  BoxArray *in_RDI;
  Box result_2;
  int idim;
  Box result;
  Box dom2;
  Box *dom;
  IntVect fac;
  BoxArray *ba;
  IntVect shft;
  int dir_1;
  IntVect off_1;
  int dir;
  IntVect off;
  size_type in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  int in_stack_fffffffffffff874;
  int local_788;
  int local_784;
  int local_77c;
  int in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  int in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  int local_768;
  int local_764;
  int in_stack_fffffffffffff8ac;
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  int in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  int in_stack_fffffffffffff8c0;
  int in_stack_fffffffffffff8c4;
  int local_734;
  int local_730;
  int local_72c;
  int local_71c;
  int local_718;
  int local_714;
  int local_70c;
  int local_708;
  int local_704;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  undefined3 uVar9;
  undefined4 in_stack_fffffffffffff930;
  int in_stack_fffffffffffff934;
  BoxArray *this_01;
  bool local_6b5;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_694;
  int local_690;
  int local_68c;
  int local_67c;
  int local_678;
  int local_674;
  int local_66c;
  int local_668;
  int local_664;
  int local_65c;
  int local_658;
  int local_654;
  int local_644;
  int local_640;
  int local_63c;
  int local_634;
  int local_630;
  int local_62c;
  int local_624;
  int local_620;
  int local_61c;
  bool local_5dd;
  undefined8 local_5b4;
  undefined8 local_5ac;
  undefined8 local_5a4;
  uint local_59c;
  undefined1 local_595;
  int local_594;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  uint local_578;
  undefined1 local_574 [72];
  int local_52c;
  undefined1 *local_528;
  IntVect local_520;
  undefined4 local_514;
  undefined8 *local_510;
  int local_508 [2];
  int local_500;
  int local_4f8;
  int iStack_4f4;
  int local_4f0;
  IntVect local_4ec;
  IntVect *local_4e0;
  BoxArray *local_4d8;
  IntVect *local_4d0;
  IntVect *local_4c8;
  int *local_4c0;
  IntVect *local_4b8;
  undefined4 local_4ac;
  IntVect *local_4a8;
  undefined4 local_49c;
  IntVect *local_498;
  undefined4 local_48c;
  IntVect *local_488;
  undefined4 local_47c;
  IntVect *local_478;
  undefined4 local_46c;
  int *local_468;
  undefined4 local_45c;
  int *local_458;
  undefined4 local_44c;
  int *local_448;
  IntVect local_440;
  undefined4 local_434;
  Box *local_430;
  int *local_428;
  Box *local_420;
  int local_418 [2];
  int local_410;
  undefined1 *local_408;
  BoxArray *local_400;
  IntVect local_3f8;
  undefined4 local_3ec;
  undefined1 *local_3e8;
  undefined4 local_3dc;
  undefined1 *local_3d8;
  undefined4 local_3cc;
  undefined1 *local_3c8;
  int local_3c0 [2];
  int local_3b8;
  IntVect *local_3b0;
  IntVect local_3a4;
  IntVect *local_398;
  IntVect *local_390;
  undefined4 local_384;
  IntVect *local_380;
  undefined4 local_374;
  IntVect *local_370;
  undefined4 local_364;
  IntVect *local_360;
  IntVect *local_358;
  BoxArray *local_350;
  undefined4 local_344;
  IntVect *local_340;
  undefined4 local_334;
  IntVect *local_330;
  undefined4 local_324;
  IntVect *local_320;
  IntVect *local_318;
  IntVect *local_310;
  undefined4 local_304;
  IntVect *local_300;
  undefined4 local_2f4;
  IntVect *local_2f0;
  undefined4 local_2e4;
  IntVect *local_2e0;
  int local_2d8;
  IntVect local_2d4;
  int *local_2c8;
  undefined8 *local_2c0;
  int local_2b4;
  long local_2b0;
  undefined4 local_2a4;
  int *local_2a0;
  int local_294;
  int *local_290;
  IntVect *local_288;
  long local_280;
  undefined4 local_274;
  IntVect *local_270;
  undefined4 local_264;
  IntVect *local_260;
  undefined4 local_254;
  IntVect *local_250;
  int local_244;
  uint *local_240;
  int local_234;
  uint *local_230;
  int local_224;
  int local_220;
  IntVect local_21c;
  IntVect *local_210;
  undefined8 *local_208;
  int local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  int local_1dc;
  IntVect *local_1d8;
  IntVect *local_1d0;
  long local_1c8;
  undefined4 local_1bc;
  IntVect *local_1b8;
  undefined4 local_1ac;
  IntVect *local_1a8;
  undefined4 local_19c;
  IntVect *local_198;
  int local_18c;
  uint *local_188;
  int local_17c;
  uint *local_178;
  int local_16c;
  IntVect *local_168;
  long local_160;
  IntVect *local_158;
  long local_150;
  IntVect *local_148;
  undefined8 *local_140;
  int *local_138;
  long local_130;
  int *local_128;
  long local_120;
  int *local_118;
  undefined8 *local_110;
  uint *local_108;
  uint *local_100;
  undefined4 local_f8;
  int local_f4;
  IntVect *local_f0;
  undefined4 local_e8;
  int local_e4;
  IntVect *local_e0;
  int local_d4;
  int local_d0;
  int local_c8;
  int local_c4;
  int local_bc;
  int local_b8;
  int local_b0;
  int local_ac;
  int local_a4;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_68;
  int local_64;
  int local_5c;
  int local_58;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  undefined4 uVar10;
  
  IntVect::IntVect((IntVect *)(local_574 + 0x28),2);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                       in_stack_fffffffffffff868);
  local_574._28_8_ = Geometry::Domain(this_00);
  local_434 = 2;
  local_590 = *(long *)(((Box *)local_574._28_8_)->smallend).vect;
  local_588 = *(long *)((((Box *)local_574._28_8_)->smallend).vect + 2);
  local_580 = *(long *)((((Box *)local_574._28_8_)->bigend).vect + 1);
  local_578 = (((Box *)local_574._28_8_)->btype).itype;
  local_430 = (Box *)local_574._28_8_;
  IntVect::IntVect(&local_440,2);
  lVar4 = local_580;
  lVar3 = local_588;
  lVar2 = local_590;
  local_208 = &local_590;
  local_210 = &local_440;
  local_1ec = 1;
  local_5dd = true;
  if ((local_440.vect[0] == 1) && (local_5dd = true, local_440.vect[1] == 1)) {
    local_5dd = local_440.vect[2] != 1;
  }
  local_1e8 = local_210;
  if (local_5dd) {
    local_50 = (int)local_590;
    local_4c = local_50;
    if (local_440.vect[0] != 1) {
      if (local_440.vect[0] == 2) {
        if ((int)local_590 < 0) {
          iVar7 = (int)local_590 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_61c = -iVar7 / 2 + -1;
        }
        else {
          local_61c = (int)local_590 / 2;
        }
        local_4c = local_61c;
      }
      else if (local_440.vect[0] == 4) {
        if ((int)local_590 < 0) {
          iVar7 = (int)local_590 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_620 = -iVar7 / 4 + -1;
        }
        else {
          local_620 = (int)local_590 / 4;
        }
        local_4c = local_620;
      }
      else {
        if ((int)local_590 < 0) {
          iVar7 = (int)local_590 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_624 = -iVar7 / local_440.vect[0] + -1;
        }
        else {
          local_624 = (int)local_590 / local_440.vect[0];
        }
        local_4c = local_624;
      }
    }
    local_5c = local_590._4_4_;
    local_590._0_4_ = local_4c;
    local_58 = local_5c;
    if (local_440.vect[1] != 1) {
      if (local_440.vect[1] == 2) {
        if (lVar2 < 0) {
          iVar7 = local_5c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_62c = -iVar7 / 2 + -1;
        }
        else {
          local_62c = local_5c / 2;
        }
        local_58 = local_62c;
      }
      else if (local_440.vect[1] == 4) {
        if (lVar2 < 0) {
          iVar7 = local_5c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_630 = -iVar7 / 4 + -1;
        }
        else {
          local_630 = local_5c / 4;
        }
        local_58 = local_630;
      }
      else {
        if (lVar2 < 0) {
          iVar7 = local_5c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_634 = -iVar7 / local_440.vect[1] + -1;
        }
        else {
          local_634 = local_5c / local_440.vect[1];
        }
        local_58 = local_634;
      }
    }
    local_590._4_4_ = local_58;
    local_68 = (int)local_588;
    local_64 = local_68;
    if (local_440.vect[2] != 1) {
      if (local_440.vect[2] == 2) {
        if ((int)local_588 < 0) {
          iVar7 = (int)local_588 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_63c = -iVar7 / 2 + -1;
        }
        else {
          local_63c = (int)local_588 / 2;
        }
        local_64 = local_63c;
      }
      else if (local_440.vect[2] == 4) {
        if ((int)local_588 < 0) {
          iVar7 = (int)local_588 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_640 = -iVar7 / 4 + -1;
        }
        else {
          local_640 = (int)local_588 / 4;
        }
        local_64 = local_640;
      }
      else {
        if ((int)local_588 < 0) {
          iVar7 = (int)local_588 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_644 = -iVar7 / local_440.vect[2] + -1;
        }
        else {
          local_644 = (int)local_588 / local_440.vect[2];
        }
        local_64 = local_644;
      }
    }
    local_694 = local_588._4_4_;
    local_588._0_4_ = local_64;
    local_108 = &local_578;
    local_148 = local_210;
    local_140 = local_208;
    if (local_578 == 0) {
      local_150 = (long)&local_588 + 4;
      local_2c = local_694;
      local_28 = local_2c;
      if (local_440.vect[0] != 1) {
        if (local_440.vect[0] == 2) {
          if (lVar3 < 0) {
            local_694 = local_694 + 1;
            if (local_694 < 1) {
              local_694 = -local_694;
            }
            local_68c = -local_694 / 2 + -1;
          }
          else {
            local_68c = local_694 / 2;
          }
          local_28 = local_68c;
        }
        else if (local_440.vect[0] == 4) {
          if (lVar3 < 0) {
            local_694 = local_694 + 1;
            if (local_694 < 1) {
              local_694 = -local_694;
            }
            local_690 = -local_694 / 4 + -1;
          }
          else {
            local_690 = local_694 / 4;
          }
          local_28 = local_690;
        }
        else {
          if (lVar3 < 0) {
            local_694 = local_694 + 1;
            if (local_694 < 1) {
              local_694 = -local_694;
            }
            local_694 = -local_694 / local_440.vect[0] + -1;
          }
          else {
            local_694 = local_694 / local_440.vect[0];
          }
          local_28 = local_694;
        }
      }
      local_588._4_4_ = local_28;
      local_38 = (int)local_580;
      local_34 = local_38;
      if (local_440.vect[1] != 1) {
        if (local_440.vect[1] == 2) {
          if ((int)local_580 < 0) {
            iVar7 = (int)local_580 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_69c = -iVar7 / 2 + -1;
          }
          else {
            local_69c = (int)local_580 / 2;
          }
          local_34 = local_69c;
        }
        else if (local_440.vect[1] == 4) {
          if ((int)local_580 < 0) {
            iVar7 = (int)local_580 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_6a0 = -iVar7 / 4 + -1;
          }
          else {
            local_6a0 = (int)local_580 / 4;
          }
          local_34 = local_6a0;
        }
        else {
          if ((int)local_580 < 0) {
            iVar7 = (int)local_580 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_6a4 = -iVar7 / local_440.vect[1] + -1;
          }
          else {
            local_6a4 = (int)local_580 / local_440.vect[1];
          }
          local_34 = local_6a4;
        }
      }
      local_44 = local_580._4_4_;
      local_580._0_4_ = local_34;
      local_40 = local_44;
      if (local_440.vect[2] != 1) {
        if (local_440.vect[2] == 2) {
          if (lVar4 < 0) {
            iVar7 = local_44 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_6ac = -iVar7 / 2 + -1;
          }
          else {
            local_6ac = local_44 / 2;
          }
          local_40 = local_6ac;
        }
        else if (local_440.vect[2] == 4) {
          if (lVar4 < 0) {
            iVar7 = local_44 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_6b0 = -iVar7 / 4 + -1;
          }
          else {
            local_6b0 = local_44 / 4;
          }
          local_40 = local_6b0;
        }
        else {
          if (lVar4 < 0) {
            iVar7 = local_44 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_6b4 = -iVar7 / local_440.vect[2] + -1;
          }
          else {
            local_6b4 = local_44 / local_440.vect[2];
          }
          local_40 = local_6b4;
        }
      }
      local_580._4_4_ = local_40;
      local_158 = local_210;
    }
    else {
      IntVect::IntVect(&local_21c,0);
      lVar2 = local_580;
      for (local_220 = 0; local_220 < 3; local_220 = local_220 + 1) {
        local_188 = &local_578;
        local_18c = local_220;
        local_17c = local_220;
        local_16c = local_220;
        if ((local_578 & 1 << ((byte)local_220 & 0x1f)) != 0) {
          local_1f8 = (long)&local_588 + 4;
          local_1fc = local_220;
          local_1d8 = local_210;
          local_1dc = local_220;
          if (*(int *)(local_1f8 + (long)local_220 * 4) % local_210->vect[local_220] != 0) {
            local_f0 = &local_21c;
            local_f4 = local_220;
            local_f8 = 1;
            local_f0->vect[local_220] = 1;
          }
        }
        local_178 = local_188;
      }
      local_160 = (long)&local_588 + 4;
      local_168 = local_210;
      local_8 = local_588._4_4_;
      local_c = local_210->vect[0];
      local_4 = local_8;
      if (local_c != 1) {
        if (local_c == 2) {
          if (local_588 < 0) {
            iVar7 = local_588._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_654 = -iVar7 / 2 + -1;
          }
          else {
            local_654 = local_588._4_4_ / 2;
          }
          local_4 = local_654;
        }
        else if (local_c == 4) {
          if (local_588 < 0) {
            iVar7 = local_588._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_658 = -iVar7 / 4 + -1;
          }
          else {
            local_658 = local_588._4_4_ / 4;
          }
          local_4 = local_658;
        }
        else {
          if (local_588 < 0) {
            iVar7 = local_588._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_65c = -iVar7 / local_c + -1;
          }
          else {
            local_65c = local_588._4_4_ / local_c;
          }
          local_4 = local_65c;
        }
      }
      local_588._4_4_ = local_4;
      local_14 = (int)local_580;
      local_18 = local_210->vect[1];
      local_10 = local_14;
      if (local_18 != 1) {
        if (local_18 == 2) {
          if ((int)local_580 < 0) {
            iVar7 = (int)local_580 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_664 = -iVar7 / 2 + -1;
          }
          else {
            local_664 = (int)local_580 / 2;
          }
          local_10 = local_664;
        }
        else if (local_18 == 4) {
          if ((int)local_580 < 0) {
            iVar7 = (int)local_580 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_668 = -iVar7 / 4 + -1;
          }
          else {
            local_668 = (int)local_580 / 4;
          }
          local_10 = local_668;
        }
        else {
          if ((int)local_580 < 0) {
            iVar7 = (int)local_580 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_66c = -iVar7 / local_18 + -1;
          }
          else {
            local_66c = (int)local_580 / local_18;
          }
          local_10 = local_66c;
        }
      }
      local_20 = local_580._4_4_;
      local_580._0_4_ = local_10;
      local_24 = local_210->vect[2];
      local_1c = local_20;
      if (local_24 != 1) {
        if (local_24 == 2) {
          if (lVar2 < 0) {
            iVar7 = local_20 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_674 = -iVar7 / 2 + -1;
          }
          else {
            local_674 = local_20 / 2;
          }
          local_1c = local_674;
        }
        else if (local_24 == 4) {
          if (lVar2 < 0) {
            iVar7 = local_20 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_678 = -iVar7 / 4 + -1;
          }
          else {
            local_678 = local_20 / 4;
          }
          local_1c = local_678;
        }
        else {
          if (lVar2 < 0) {
            iVar7 = local_20 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_67c = -iVar7 / local_24 + -1;
          }
          else {
            local_67c = local_20 / local_24;
          }
          local_1c = local_67c;
        }
      }
      local_580._4_4_ = local_1c;
      local_1c8 = (long)&local_588 + 4;
      local_1d0 = &local_21c;
      local_19c = 0;
      local_588._4_4_ = local_21c.vect[0] + local_588._4_4_;
      local_1ac = 1;
      iVar7 = local_580._4_4_;
      local_580._0_4_ = local_21c.vect[1] + (int)local_580;
      local_1bc = 2;
      local_580._4_4_ = local_21c.vect[2] + iVar7;
      local_1b8 = local_1d0;
      local_1a8 = local_1d0;
      local_198 = local_1d0;
    }
  }
  local_510 = &local_590;
  local_514 = 2;
  local_574._0_8_ = local_590;
  local_574._8_8_ = local_588;
  local_574._16_8_ = local_580;
  local_574._24_4_ = local_578;
  IntVect::IntVect(&local_520,2);
  this_01 = (BoxArray *)local_574;
  local_4e0 = &local_520;
  local_4ac = 1;
  local_6b5 = true;
  if ((local_520.vect[0] == 1) && (local_6b5 = true, local_520.vect[1] == 1)) {
    local_6b5 = local_520.vect[2] != 1;
  }
  local_4d8 = this_01;
  local_4a8 = local_4e0;
  if (local_6b5) {
    IntVect::IntVect(&local_4ec,1);
    local_3b0 = &(this_01->m_bat).m_op.m_bndryReg.m_loshft;
    uVar1 = local_3b0->vect[0];
    IntVect::IntVect(&local_3a4,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
    local_3b8 = local_3a4.vect[2];
    local_3c0[0] = local_3a4.vect[0];
    local_3c0[1] = local_3a4.vect[1];
    local_500 = local_3a4.vect[2];
    local_508[0] = local_3a4.vect[0];
    local_508[1] = local_3a4.vect[1];
    local_4f8 = local_3a4.vect[0];
    iStack_4f4 = local_3a4.vect[1];
    uVar5 = _local_4f8;
    local_4f0 = local_3a4.vect[2];
    local_4b8 = &local_4ec;
    local_4c0 = &local_4f8;
    local_44c = 0;
    local_4f8 = local_3a4.vect[0];
    local_4ec.vect[0] = local_4ec.vect[0] - local_4f8;
    local_45c = 1;
    iStack_4f4 = local_3a4.vect[1];
    local_4ec.vect[1] = local_4ec.vect[1] - iStack_4f4;
    local_46c = 2;
    local_4ec.vect[2] = local_4ec.vect[2] - local_3a4.vect[2];
    local_358 = local_4e0;
    local_320 = local_4e0;
    local_324 = 0;
    pBVar8 = this_01;
    _local_4f8 = uVar5;
    local_468 = local_4c0;
    local_458 = local_4c0;
    local_448 = local_4c0;
    local_350 = this_01;
    (this_01->m_bat).m_bat_type = local_4e0->vect[0] * (this_01->m_bat).m_bat_type;
    local_330 = local_358;
    local_334 = 1;
    *(int *)&(this_01->m_bat).m_op = local_358->vect[1] * *(int *)&(this_01->m_bat).m_op;
    local_340 = local_358;
    local_344 = 2;
    *(int *)((long)&(this_01->m_bat).m_op + 4) =
         local_358->vect[2] * *(int *)((long)&(this_01->m_bat).m_op + 4);
    local_310 = &(this_01->m_bat).m_op.m_bndryReg.m_crse_ratio;
    local_318 = &local_4ec;
    local_2e4 = 0;
    local_2e0 = local_318;
    local_310->vect[0] = local_4ec.vect[0] + local_310->vect[0];
    local_2f0 = local_318;
    local_2f4 = 1;
    (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] =
         local_318->vect[1] + (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1];
    local_300 = local_318;
    local_304 = 2;
    (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] =
         local_318->vect[2] + (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2];
    local_390 = &(this_01->m_bat).m_op.m_bndryReg.m_crse_ratio;
    local_398 = local_4e0;
    local_360 = local_4e0;
    local_364 = 0;
    local_390->vect[0] = local_4e0->vect[0] * local_390->vect[0];
    local_370 = local_398;
    local_374 = 1;
    (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] =
         local_398->vect[1] * (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1];
    local_380 = local_398;
    local_384 = 2;
    (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] =
         local_398->vect[2] * (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2];
    local_4c8 = &(this_01->m_bat).m_op.m_bndryReg.m_crse_ratio;
    local_4d0 = &local_4ec;
    local_47c = 0;
    local_478 = local_4d0;
    local_4c8->vect[0] = local_4c8->vect[0] - local_4ec.vect[0];
    local_488 = local_4d0;
    local_48c = 1;
    (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] =
         (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] - local_4d0->vect[1];
    local_498 = local_4d0;
    local_49c = 2;
    (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] =
         (this_01->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] - local_4d0->vect[2];
    this_01 = pBVar8;
  }
  for (local_594 = 0; local_594 < 3; local_594 = local_594 + 1) {
    in_stack_fffffffffffff934 = Box::length((Box *)local_574._28_8_,local_594);
    iVar7 = Box::length((Box *)local_574,local_594);
    if (in_stack_fffffffffffff934 != iVar7) {
      local_52c = local_594;
      *(undefined4 *)(local_574 + 0x28 + (long)local_594 * 4) = 1;
      local_528 = local_574 + 0x28;
    }
  }
  local_595 = 0;
  local_420 = (Box *)local_574._28_8_;
  local_428 = (int *)(local_574 + 0x28);
  lVar2 = *(long *)local_574._28_8_;
  lVar3 = *(long *)(local_574._28_8_ + 8);
  lVar4 = *(long *)(local_574._28_8_ + 0x10);
  local_59c = ((IndexType *)(local_574._28_8_ + 0x18))->itype;
  local_2c0 = &local_5b4;
  local_2a4 = 1;
  uVar9 = (undefined3)in_stack_fffffffffffff930;
  uVar10 = CONCAT13(1,uVar9);
  if ((local_574._40_4_ == 1) && (uVar10 = CONCAT13(1,uVar9), local_574._44_4_ == 1)) {
    uVar10 = CONCAT13(local_574._48_4_ != 1,uVar9);
  }
  local_5b4 = lVar2;
  local_5ac = lVar3;
  local_5a4 = lVar4;
  local_2c8 = local_428;
  local_2a0 = local_428;
  if ((char)((uint)uVar10 >> 0x18) != '\0') {
    local_5b4._0_4_ = (int)lVar2;
    local_bc = (int)local_5b4;
    local_b8 = local_bc;
    if (local_574._40_4_ != 1) {
      if (local_574._40_4_ == 2) {
        if ((int)local_5b4 < 0) {
          iVar7 = (int)local_5b4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_6f4 = -iVar7 / 2 + -1;
        }
        else {
          local_6f4 = (int)local_5b4 / 2;
        }
        local_b8 = local_6f4;
      }
      else if (local_574._40_4_ == 4) {
        if ((int)local_5b4 < 0) {
          iVar7 = (int)local_5b4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_6f8 = -iVar7 / 4 + -1;
        }
        else {
          local_6f8 = (int)local_5b4 / 4;
        }
        local_b8 = local_6f8;
      }
      else {
        if ((int)local_5b4 < 0) {
          iVar7 = (int)local_5b4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_6fc = -iVar7 / (int)local_574._40_4_ + -1;
        }
        else {
          local_6fc = (int)local_5b4 / (int)local_574._40_4_;
        }
        local_b8 = local_6fc;
      }
    }
    local_5b4._4_4_ = (int)((ulong)lVar2 >> 0x20);
    local_c8 = local_5b4._4_4_;
    local_5b4._0_4_ = local_b8;
    local_c4 = local_c8;
    if (local_574._44_4_ != 1) {
      if (local_574._44_4_ == 2) {
        if (lVar2 < 0) {
          iVar7 = local_c8 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_704 = -iVar7 / 2 + -1;
        }
        else {
          local_704 = local_c8 / 2;
        }
        local_c4 = local_704;
      }
      else if (local_574._44_4_ == 4) {
        if (lVar2 < 0) {
          iVar7 = local_c8 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_708 = -iVar7 / 4 + -1;
        }
        else {
          local_708 = local_c8 / 4;
        }
        local_c4 = local_708;
      }
      else {
        if (lVar2 < 0) {
          iVar7 = local_c8 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_70c = -iVar7 / (int)local_574._44_4_ + -1;
        }
        else {
          local_70c = local_c8 / (int)local_574._44_4_;
        }
        local_c4 = local_70c;
      }
    }
    local_5b4._4_4_ = local_c4;
    local_5ac._0_4_ = (int)lVar3;
    local_d4 = (int)local_5ac;
    local_d0 = local_d4;
    if (local_574._48_4_ != 1) {
      if (local_574._48_4_ == 2) {
        if ((int)local_5ac < 0) {
          iVar7 = (int)local_5ac + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_714 = -iVar7 / 2 + -1;
        }
        else {
          local_714 = (int)local_5ac / 2;
        }
        local_d0 = local_714;
      }
      else if (local_574._48_4_ == 4) {
        if ((int)local_5ac < 0) {
          iVar7 = (int)local_5ac + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_718 = -iVar7 / 4 + -1;
        }
        else {
          local_718 = (int)local_5ac / 4;
        }
        local_d0 = local_718;
      }
      else {
        if ((int)local_5ac < 0) {
          iVar7 = (int)local_5ac + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          local_71c = -iVar7 / (int)local_574._48_4_ + -1;
        }
        else {
          local_71c = (int)local_5ac / (int)local_574._48_4_;
        }
        local_d0 = local_71c;
      }
    }
    local_5ac._4_4_ = (int)((ulong)lVar3 >> 0x20);
    local_768 = local_5ac._4_4_;
    local_5ac._0_4_ = local_d0;
    local_100 = &local_59c;
    local_118 = local_428;
    local_110 = local_2c0;
    if (local_59c == 0) {
      local_120 = (long)&local_5ac + 4;
      local_98 = local_768;
      local_94 = local_98;
      if (local_574._40_4_ != 1) {
        if (local_574._40_4_ == 2) {
          if (lVar3 < 0) {
            local_768 = local_768 + 1;
            if (local_768 < 1) {
              local_768 = -local_768;
            }
            local_764 = -local_768 / 2 + -1;
          }
          else {
            local_764 = local_768 / 2;
          }
          local_94 = local_764;
        }
        else if (local_574._40_4_ == 4) {
          if (lVar3 < 0) {
            local_768 = local_768 + 1;
            if (local_768 < 1) {
              local_768 = -local_768;
            }
            local_768 = -local_768 / 4 + -1;
          }
          else {
            local_768 = local_768 / 4;
          }
          local_94 = local_768;
        }
        else if (lVar3 < 0) {
          local_768 = local_768 + 1;
          if (local_768 < 1) {
            local_768 = -local_768;
          }
          in_stack_fffffffffffff894 = -local_768 / (int)local_574._40_4_ + -1;
          local_94 = in_stack_fffffffffffff894;
        }
        else {
          in_stack_fffffffffffff894 = local_768 / (int)local_574._40_4_;
          local_94 = in_stack_fffffffffffff894;
        }
      }
      local_5ac._4_4_ = local_94;
      local_5a4._0_4_ = (int)lVar4;
      local_a4 = (int)local_5a4;
      local_a0 = local_a4;
      if (local_574._44_4_ != 1) {
        if (local_574._44_4_ == 2) {
          if ((int)local_5a4 < 0) {
            iVar7 = (int)local_5a4 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            in_stack_fffffffffffff88c = -iVar7 / 2 + -1;
            local_a0 = in_stack_fffffffffffff88c;
          }
          else {
            in_stack_fffffffffffff88c = (int)local_5a4 / 2;
            local_a0 = in_stack_fffffffffffff88c;
          }
        }
        else if (local_574._44_4_ == 4) {
          if ((int)local_5a4 < 0) {
            iVar7 = (int)local_5a4 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            in_stack_fffffffffffff888 = -iVar7 / 4 + -1;
            local_a0 = in_stack_fffffffffffff888;
          }
          else {
            in_stack_fffffffffffff888 = (int)local_5a4 / 4;
            local_a0 = in_stack_fffffffffffff888;
          }
        }
        else {
          if ((int)local_5a4 < 0) {
            iVar7 = (int)local_5a4 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_77c = -iVar7 / (int)local_574._44_4_ + -1;
          }
          else {
            local_77c = (int)local_5a4 / (int)local_574._44_4_;
          }
          local_a0 = local_77c;
        }
      }
      local_5a4._4_4_ = (int)((ulong)lVar4 >> 0x20);
      local_b0 = local_5a4._4_4_;
      local_5a4._0_4_ = local_a0;
      local_ac = local_b0;
      if (local_574._48_4_ != 1) {
        if (local_574._48_4_ == 2) {
          if (lVar4 < 0) {
            iVar7 = local_b0 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_784 = -iVar7 / 2 + -1;
          }
          else {
            local_784 = local_b0 / 2;
          }
          local_ac = local_784;
        }
        else if (local_574._48_4_ == 4) {
          if (lVar4 < 0) {
            iVar7 = local_b0 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_788 = -iVar7 / 4 + -1;
          }
          else {
            local_788 = local_b0 / 4;
          }
          local_ac = local_788;
        }
        else if (lVar4 < 0) {
          iVar7 = local_b0 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          in_stack_fffffffffffff874 = -iVar7 / (int)local_574._48_4_ + -1;
          local_ac = in_stack_fffffffffffff874;
        }
        else {
          in_stack_fffffffffffff874 = local_b0 / (int)local_574._48_4_;
          local_ac = in_stack_fffffffffffff874;
        }
      }
      local_5a4._4_4_ = local_ac;
      in_stack_fffffffffffff890 = local_574._44_4_;
      local_5ac = local_5ac;
      local_5a4 = local_5a4;
      local_128 = local_428;
    }
    else {
      IntVect::IntVect(&local_2d4,0);
      lVar2 = local_5a4;
      for (local_2d8 = 0; local_2d8 < 3; local_2d8 = local_2d8 + 1) {
        local_240 = &local_59c;
        local_244 = local_2d8;
        local_234 = local_2d8;
        local_224 = local_2d8;
        if ((local_59c & 1 << ((byte)local_2d8 & 0x1f)) != 0) {
          local_2b0 = (long)&local_5ac + 4;
          local_2b4 = local_2d8;
          local_290 = local_2c8;
          local_294 = local_2d8;
          if (*(int *)(local_2b0 + (long)local_2d8 * 4) % local_2c8[local_2d8] != 0) {
            local_e0 = &local_2d4;
            local_e4 = local_2d8;
            local_e8 = 1;
            local_e0->vect[local_2d8] = 1;
          }
        }
        local_230 = local_240;
      }
      local_130 = (long)&local_5ac + 4;
      local_138 = local_2c8;
      local_74 = local_5ac._4_4_;
      local_78 = *local_2c8;
      local_70 = local_74;
      if (local_78 != 1) {
        if (local_78 == 2) {
          if (local_5ac < 0) {
            iVar7 = local_5ac._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_72c = -iVar7 / 2 + -1;
          }
          else {
            local_72c = local_5ac._4_4_ / 2;
          }
          local_70 = local_72c;
        }
        else if (local_78 == 4) {
          if (local_5ac < 0) {
            iVar7 = local_5ac._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_730 = -iVar7 / 4 + -1;
          }
          else {
            local_730 = local_5ac._4_4_ / 4;
          }
          local_70 = local_730;
        }
        else {
          if (local_5ac < 0) {
            iVar7 = local_5ac._4_4_ + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            local_734 = -iVar7 / local_78 + -1;
          }
          else {
            local_734 = local_5ac._4_4_ / local_78;
          }
          local_70 = local_734;
        }
      }
      local_5ac._4_4_ = local_70;
      local_80 = (int)local_5a4;
      local_84 = local_2c8[1];
      local_7c = local_80;
      if (local_84 != 1) {
        if (local_84 == 2) {
          if ((int)local_5a4 < 0) {
            iVar7 = (int)local_5a4 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            in_stack_fffffffffffff8c4 = -iVar7 / 2 + -1;
            local_7c = in_stack_fffffffffffff8c4;
          }
          else {
            in_stack_fffffffffffff8c4 = (int)local_5a4 / 2;
            local_7c = in_stack_fffffffffffff8c4;
          }
        }
        else if (local_84 == 4) {
          if ((int)local_5a4 < 0) {
            iVar7 = (int)local_5a4 + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            in_stack_fffffffffffff8c0 = -iVar7 / 4 + -1;
            local_7c = in_stack_fffffffffffff8c0;
          }
          else {
            in_stack_fffffffffffff8c0 = (int)local_5a4 / 4;
            local_7c = in_stack_fffffffffffff8c0;
          }
        }
        else if ((int)local_5a4 < 0) {
          iVar7 = (int)local_5a4 + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          in_stack_fffffffffffff8bc = -iVar7 / local_84 + -1;
          local_7c = in_stack_fffffffffffff8bc;
        }
        else {
          in_stack_fffffffffffff8bc = (int)local_5a4 / local_84;
          local_7c = in_stack_fffffffffffff8bc;
        }
      }
      local_8c = local_5a4._4_4_;
      local_5a4._0_4_ = local_7c;
      in_stack_fffffffffffff8b8 = local_2c8[2];
      local_88 = local_8c;
      if (in_stack_fffffffffffff8b8 != 1) {
        if (in_stack_fffffffffffff8b8 == 2) {
          if (lVar2 < 0) {
            iVar7 = local_8c + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            in_stack_fffffffffffff8b4 = -iVar7 / 2 + -1;
            local_88 = in_stack_fffffffffffff8b4;
          }
          else {
            in_stack_fffffffffffff8b4 = local_8c / 2;
            local_88 = in_stack_fffffffffffff8b4;
          }
        }
        else if (in_stack_fffffffffffff8b8 == 4) {
          if (lVar2 < 0) {
            iVar7 = local_8c + 1;
            if (iVar7 < 1) {
              iVar7 = -iVar7;
            }
            in_stack_fffffffffffff8b0 = -iVar7 / 4 + -1;
            local_88 = in_stack_fffffffffffff8b0;
          }
          else {
            in_stack_fffffffffffff8b0 = local_8c / 4;
            local_88 = in_stack_fffffffffffff8b0;
          }
        }
        else if (lVar2 < 0) {
          iVar7 = local_8c + 1;
          if (iVar7 < 1) {
            iVar7 = -iVar7;
          }
          in_stack_fffffffffffff8ac = -iVar7 / in_stack_fffffffffffff8b8 + -1;
          local_88 = in_stack_fffffffffffff8ac;
        }
        else {
          in_stack_fffffffffffff8ac = local_8c / in_stack_fffffffffffff8b8;
          local_88 = in_stack_fffffffffffff8ac;
        }
      }
      local_5a4._4_4_ = local_88;
      local_280 = (long)&local_5ac + 4;
      local_288 = &local_2d4;
      local_254 = 0;
      local_5ac._4_4_ = local_2d4.vect[0] + local_5ac._4_4_;
      local_264 = 1;
      iVar7 = local_5a4._4_4_;
      local_5a4._0_4_ = local_2d4.vect[1] + (int)local_5a4;
      local_274 = 2;
      local_5a4._4_4_ = local_2d4.vect[2] + iVar7;
      local_5ac = local_5ac;
      local_5a4 = local_5a4;
      local_270 = local_288;
      local_260 = local_288;
      local_250 = local_288;
      local_90 = in_stack_fffffffffffff8b8;
    }
  }
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                     (Box *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
  pBVar8 = (BoxArray *)
           Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                     ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                      in_stack_fffffffffffff868);
  local_408 = local_574 + 0x28;
  local_3cc = 0;
  local_3dc = 1;
  iVar7 = *(int *)&(pBVar8->m_bat).m_op / (int)local_574._44_4_;
  local_3ec = 2;
  local_400 = pBVar8;
  local_3e8 = local_408;
  local_3d8 = local_408;
  local_3c8 = local_408;
  IntVect::IntVect(&local_3f8,(int)(pBVar8->m_bat).m_bat_type / (int)local_574._40_4_,iVar7,
                   *(int *)((long)&(pBVar8->m_bat).m_op + 4) / (int)local_574._48_4_);
  local_410 = local_3f8.vect[2];
  local_418[0] = local_3f8.vect[0];
  local_418[1] = local_3f8.vect[1];
  BoxArray::maxSize(this_01,(IntVect *)CONCAT44(in_stack_fffffffffffff934,uVar10));
  BoxArray::refine((BoxArray *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                   (IntVect *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  if ((*(byte *)((long)in_RSI + 0x81) & 1) != 0) {
    ParallelDescriptor::NProcs();
    ChopGrids((AmrMesh *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
              in_stack_fffffffffffff8bc,
              (BoxArray *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
              in_stack_fffffffffffff8ac);
  }
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
             CONCAT44(in_stack_fffffffffffff874,iVar7),(size_type)pBVar8);
  bVar6 = BoxArray::operator==
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                     (BoxArray *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
  if (bVar6) {
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_fffffffffffff874,iVar7),(size_type)pBVar8);
    BoxArray::operator=((BoxArray *)CONCAT44(in_stack_fffffffffffff874,iVar7),pBVar8);
  }
  (**(code **)(*in_RSI + 0x28))(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

BoxArray
AmrMesh::MakeBaseGrids () const
{
    IntVect fac(2);
    const Box& dom = geom[0].Domain();
    const Box dom2 = amrex::refine(amrex::coarsen(dom,2),2);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (dom.length(idim) != dom2.length(idim)) {
            fac[idim] = 1;
        }
    }
    BoxArray ba(amrex::coarsen(dom,fac));
    ba.maxSize(max_grid_size[0]/fac);
    ba.refine(fac);
    // Boxes in ba have even number of cells in each direction
    // unless the domain has odd number of cells in that direction.
    if (refine_grid_layout) {
        ChopGrids(0, ba, ParallelDescriptor::NProcs());
    }
    if (ba == grids[0]) {
        ba = grids[0];  // to avoid duplicates
    }
    PostProcessBaseGrids(ba);
    return ba;
}